

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

StringObject * parse_user_defined_type_name(LexerState *ls,StringObject *type_name)

{
  char *pcVar1;
  CompilerState *compiler_state;
  undefined8 uVar2;
  int iVar3;
  StringObject *pSVar4;
  size_t sVar5;
  ulong uVar6;
  size_t newlen;
  char *str;
  char buffer [256];
  size_t len;
  StringObject *type_name_local;
  LexerState *ls_local;
  
  buffer[0xf8] = '\0';
  buffer[0xf9] = '\0';
  buffer[0xfa] = '\0';
  buffer[0xfb] = '\0';
  buffer[0xfc] = '\0';
  buffer[0xfd] = '\0';
  buffer[0xfe] = '\0';
  buffer[0xff] = '\0';
  iVar3 = testnext(ls,0x2e);
  len = (size_t)type_name;
  if (iVar3 != 0) {
    memset(&str,0,0x100);
    pcVar1 = type_name->str;
    buffer._248_8_ = strlen(pcVar1);
    if (0xff < (ulong)buffer._248_8_) {
      raviX_syntaxerror(ls,"User defined type name is too long");
      return type_name;
    }
    snprintf((char *)&str,0x100,"%s",pcVar1);
    do {
      pSVar4 = check_name_and_next(ls);
      uVar2 = buffer._248_8_;
      pcVar1 = pSVar4->str;
      sVar5 = strlen(pcVar1);
      uVar6 = uVar2 + sVar5 + 1;
      if (0xff < uVar6) {
        raviX_syntaxerror(ls,"User defined type name is too long");
        return pSVar4;
      }
      snprintf(buffer + buffer._248_8_ + -8,0x100 - buffer._248_8_,".%s",pcVar1);
      buffer._248_8_ = uVar6;
      iVar3 = testnext(ls,0x2e);
    } while (iVar3 != 0);
    compiler_state = ls->compiler_state;
    sVar5 = strlen((char *)&str);
    len = (size_t)raviX_create_string(compiler_state,(char *)&str,(uint32_t)sVar5);
  }
  return (StringObject *)len;
}

Assistant:

static const StringObject *parse_user_defined_type_name(LexerState *ls,
								const StringObject *type_name)
{
	size_t len = 0;
	if (testnext(ls, '.')) {
		char buffer[256] = {0};
		const char *str = type_name->str;
		len = strlen(str);
		if (len >= sizeof buffer) {
			raviX_syntaxerror(ls, "User defined type name is too long");
			return type_name;
		}
		snprintf(buffer, sizeof buffer, "%s", str);
		do {
			type_name = check_name_and_next(ls);
			str = type_name->str;
			size_t newlen = len + strlen(str) + 1;
			if (newlen >= sizeof buffer) {
				raviX_syntaxerror(ls, "User defined type name is too long");
				return type_name;
			}
			snprintf(buffer + len, sizeof buffer - len, ".%s", str);
			len = newlen;
		} while (testnext(ls, '.'));
		type_name = raviX_create_string(ls->compiler_state, buffer, (uint32_t)strlen(buffer));
	}
	return type_name;
}